

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::InsertValueCompensation
          (GlobOpt *this,BasicBlock *predecessor,BasicBlock *successor,
          SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)

{
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar1;
  ValueType valueType;
  Func *func_00;
  JitArenaAllocator *pJVar2;
  code *pcVar3;
  anon_class_16_2_d2cdac2c map;
  Value *pVVar4;
  StackSym *pSVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  IRType IVar9;
  BOOLEAN BVar10;
  Bits BVar11;
  int iVar12;
  uint uVar13;
  ValueNumber VVar14;
  ValueNumber VVar15;
  undefined4 *puVar16;
  Sym **ppSVar17;
  ValueInfo **ppVVar18;
  RegOpnd *pRVar19;
  RegOpnd *pRVar20;
  Opnd *pOVar21;
  ValueInfo *pVVar22;
  ValueInfo *pVVar23;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar24;
  anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *paVar25;
  Value *pVVar26;
  Sym *symStore;
  GlobOptBlockData *this_00;
  GlobOptBlockData *this_01;
  StackSym *local_4e0;
  StackSym *local_4d0;
  StackSym *local_4c0;
  DelayChangeValueInfo local_1b8;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a4;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1a2;
  Value *local_1a0;
  Value *mergedLengthValue;
  Value *predecessorLengthValue;
  Instr *newInstr_2;
  Value *local_180;
  Value *mergedHeadSegmentLengthValue;
  Value *predecessorHeadSegmentLengthValue;
  Instr *newInstr_1;
  Instr *newInstr;
  StackSym *pSStack_158;
  bool compensated;
  StackSym *mergedLengthSym;
  StackSym *mergedHeadSegmentLengthSym;
  StackSym *mergedHeadSegmentSym;
  ArrayValueInfo *mergedArrayValueInfo;
  ValueInfo *mergedValueInfo;
  StackSym *predecessorLengthSym;
  StackSym *predecessorHeadSegmentLengthSym;
  StackSym *predecessorHeadSegmentSym;
  ArrayValueInfo *predecessorArrayValueInfo;
  ValueInfo *predecessorValueInfo;
  Value *predecessorValue;
  Sym *sym;
  EntryType *entry;
  undefined1 local_e0 [8];
  EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  it;
  List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  delayChangeValueInfo;
  GlobOptBlockData *successorBlockData;
  GlobOptBlockData *predecessorBlockData;
  bool updateSuccessorBlockData;
  bool setLastInstrInPredecessor;
  Func *func;
  Instr *insertBeforeInstr;
  SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap_local;
  BasicBlock *successor_local;
  BasicBlock *predecessor_local;
  GlobOpt *this_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  ValueType merged_1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_24;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_22;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType merged;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  if (predecessor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49a,"(predecessor)","predecessor");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  if (successor == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49b,"(successor)","successor");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  if (predecessor == successor) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49c,"(predecessor != successor)","predecessor != successor");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  iVar12 = JsUtil::
           BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Count(symsRequiringCompensationToMergedValueInfoMap);
  if (iVar12 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x49d,"(symsRequiringCompensationToMergedValueInfoMap->Count() != 0)",
                       "symsRequiringCompensationToMergedValueInfoMap->Count() != 0");
    if (!bVar6) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar16 = 0;
  }
  func = (Func *)BasicBlock::GetLastInstr(predecessor);
  func_00 = (Func *)func->m_workItem;
  bVar6 = true;
  if ((*(uint *)&this->field_0xf4 >> 7 & 1) != 0) {
    uVar13 = BasicBlock::GetDataUseCount(successor);
    bVar6 = uVar13 != 0;
  }
  bVar7 = IR::Instr::IsBranchInstr((Instr *)func);
  if ((bVar7) || (*(OpCode *)&func->constructorCacheCount == BailTarget)) {
    while (*(short *)&func->m_scriptContextInfo[6]._vptr_ScriptContextInfo == 0x244) {
      func = (Func *)func->m_scriptContextInfo;
    }
    bVar7 = false;
  }
  else {
    if ((Instr *)func->m_threadContextInfo == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4b2,"(insertBeforeInstr->m_next)","insertBeforeInstr->m_next");
      if (!bVar7) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    func = (Func *)func->m_threadContextInfo;
    bVar7 = true;
  }
  this_00 = &predecessor->globOptData;
  this_01 = &successor->globOptData;
  JsUtil::
  List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List((List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)&it.
           super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
           .usedEntryCount,&this->alloc->super_ArenaAllocator,4);
  JsUtil::
  BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::GetIterator((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                 *)local_e0,symsRequiringCompensationToMergedValueInfoMap);
  do {
    bVar8 = JsUtil::
            BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::
            EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
            ::IsValid((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                       *)local_e0);
    if (!bVar8) {
      map.this = this;
      map.predecessor = predecessor;
      JsUtil::
      List<GlobOpt::InsertValueCompensation(BasicBlock*,BasicBlock*,JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>const*)::DelayChangeValueInfo,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
      ::
      Map<GlobOpt::InsertValueCompensation(BasicBlock*,BasicBlock*,JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>const*)::__0>
                ((List<GlobOpt::InsertValueCompensation(BasicBlock*,BasicBlock*,JsUtil::BaseDictionary<Sym*,ValueInfo*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>const*)::DelayChangeValueInfo,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                  *)&it.
                     super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                     .usedEntryCount,map);
      if (bVar7) {
        BasicBlock::SetLastInstr(predecessor,(Instr *)func->m_scriptContextInfo);
      }
      JsUtil::
      List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::~List((List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)&it.
                  super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                  .usedEntryCount);
      return;
    }
    sym = (Sym *)JsUtil::
                 BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::
                 IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                 ::Current((IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                            *)local_e0);
    ppSVar17 = JsUtil::anon_unknown_4::KeyValueEntry<Sym_*,_ValueInfo_*>::Key
                         ((KeyValueEntry<Sym_*,_ValueInfo_*> *)sym);
    predecessorValue = (Value *)*ppSVar17;
    predecessorValueInfo = (ValueInfo *)GlobOptBlockData::FindValue(this_00,(Sym *)predecessorValue)
    ;
    if (predecessorValueInfo == (ValueInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4cd,"(predecessorValue)","predecessorValue");
      if (!bVar8) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    predecessorArrayValueInfo =
         (ArrayValueInfo *)::Value::GetValueInfo((Value *)predecessorValueInfo);
    bVar8 = ValueType::IsAnyOptimizedArray
                      (&(predecessorArrayValueInfo->super_ValueInfo).super_ValueType);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4d1,"(predecessorValueInfo->IsAnyOptimizedArray())",
                         "predecessorValueInfo->IsAnyOptimizedArray()");
      if (!bVar8) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    predecessorHeadSegmentSym =
         (StackSym *)ValueInfo::AsArrayValueInfo(&predecessorArrayValueInfo->super_ValueInfo);
    predecessorHeadSegmentLengthSym =
         ArrayValueInfo::HeadSegmentSym((ArrayValueInfo *)predecessorHeadSegmentSym);
    predecessorLengthSym =
         ArrayValueInfo::HeadSegmentLengthSym((ArrayValueInfo *)predecessorHeadSegmentSym);
    mergedValueInfo =
         (ValueInfo *)ArrayValueInfo::LengthSym((ArrayValueInfo *)predecessorHeadSegmentSym);
    ppVVar18 = JsUtil::anon_unknown_4::
               ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
               ::Value((ValueEntry<ValueInfo_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Sym_*,_ValueInfo_*>_>
                        *)sym);
    mergedArrayValueInfo = (ArrayValueInfo *)*ppVVar18;
    mergedHeadSegmentSym =
         (StackSym *)ValueInfo::AsArrayValueInfo((ValueInfo *)mergedArrayValueInfo);
    mergedHeadSegmentLengthSym =
         ArrayValueInfo::HeadSegmentSym((ArrayValueInfo *)mergedHeadSegmentSym);
    mergedLengthSym = ArrayValueInfo::HeadSegmentLengthSym((ArrayValueInfo *)mergedHeadSegmentSym);
    pSStack_158 = ArrayValueInfo::LengthSym((ArrayValueInfo *)mergedHeadSegmentSym);
    if ((mergedHeadSegmentLengthSym != (StackSym *)0x0) &&
       (predecessorHeadSegmentLengthSym == (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4db,"(!mergedHeadSegmentSym || predecessorHeadSegmentSym)",
                         "!mergedHeadSegmentSym || predecessorHeadSegmentSym");
      if (!bVar8) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    if ((mergedLengthSym != (StackSym *)0x0) && (predecessorLengthSym == (StackSym *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dc,"(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym)",
                         "!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym");
      if (!bVar8) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    if ((pSStack_158 != (StackSym *)0x0) && (mergedValueInfo == (ValueInfo *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4dd,"(!mergedLengthSym || predecessorLengthSym)",
                         "!mergedLengthSym || predecessorLengthSym");
      if (!bVar8) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar16 = 0;
    }
    pSVar5 = mergedHeadSegmentLengthSym;
    newInstr._7_1_ = 0;
    if ((mergedHeadSegmentLengthSym != (StackSym *)0x0) &&
       (predecessorHeadSegmentLengthSym != mergedHeadSegmentLengthSym)) {
      IVar9 = StackSym::GetType(mergedHeadSegmentLengthSym);
      pRVar19 = IR::RegOpnd::New(pSVar5,IVar9,func_00);
      pSVar5 = predecessorHeadSegmentLengthSym;
      IVar9 = StackSym::GetType(predecessorHeadSegmentLengthSym);
      pRVar20 = IR::RegOpnd::New(pSVar5,IVar9,func_00);
      newInstr_1 = IR::Instr::New(Ld_A,&pRVar19->super_Opnd,&pRVar20->super_Opnd,func_00);
      pOVar21 = IR::Instr::GetDst(newInstr_1);
      IR::Opnd::SetIsJITOptimizedReg(pOVar21,true);
      pOVar21 = IR::Instr::GetSrc1(newInstr_1);
      IR::Opnd::SetIsJITOptimizedReg(pOVar21,true);
      IR::Instr::SetByteCodeOffset(newInstr_1,(Instr *)func);
      IR::Instr::InsertBefore((Instr *)func,newInstr_1);
      newInstr._7_1_ = 1;
    }
    pSVar5 = mergedLengthSym;
    if ((mergedLengthSym != (StackSym *)0x0) && (predecessorLengthSym != mergedLengthSym)) {
      IVar9 = StackSym::GetType(mergedLengthSym);
      pRVar19 = IR::RegOpnd::New(pSVar5,IVar9,func_00);
      pSVar5 = predecessorLengthSym;
      IVar9 = StackSym::GetType(predecessorLengthSym);
      pRVar20 = IR::RegOpnd::New(pSVar5,IVar9,func_00);
      predecessorHeadSegmentLengthValue =
           (Value *)IR::Instr::New(Ld_A,&pRVar19->super_Opnd,&pRVar20->super_Opnd,func_00);
      pOVar21 = IR::Instr::GetDst((Instr *)predecessorHeadSegmentLengthValue);
      IR::Opnd::SetIsJITOptimizedReg(pOVar21,true);
      pOVar21 = IR::Instr::GetSrc1((Instr *)predecessorHeadSegmentLengthValue);
      IR::Opnd::SetIsJITOptimizedReg(pOVar21,true);
      IR::Instr::SetByteCodeOffset((Instr *)predecessorHeadSegmentLengthValue,(Instr *)func);
      IR::Instr::InsertBefore((Instr *)func,(Instr *)predecessorHeadSegmentLengthValue);
      newInstr._7_1_ = 1;
      BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((predecessor->globOptData).liveVarSyms,
                          (predecessorLengthSym->super_Sym).m_id);
      if (BVar10 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4fe,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id))"
                           ,
                           "predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id)"
                          );
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((predecessor->globOptData).liveVarSyms,(mergedLengthSym->super_Sym).m_id);
      mergedHeadSegmentLengthValue =
           GlobOptBlockData::FindValue(this_00,&predecessorLengthSym->super_Sym);
      if (mergedHeadSegmentLengthValue == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x502,"(predecessorHeadSegmentLengthValue)",
                           "predecessorHeadSegmentLengthValue");
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      GlobOptBlockData::SetValue(this_00,mergedHeadSegmentLengthValue,&mergedLengthSym->super_Sym);
      if (bVar6) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,(mergedLengthSym->super_Sym).m_id);
        local_180 = GlobOptBlockData::FindValue(this_01,&mergedLengthSym->super_Sym);
        if (local_180 == (Value *)0x0) {
          pVVar26 = CopyValue(this,mergedHeadSegmentLengthValue);
          GlobOptBlockData::SetValue(this_01,pVVar26,&mergedLengthSym->super_Sym);
        }
        else {
          VVar14 = ::Value::GetValueNumber(local_180);
          VVar15 = ::Value::GetValueNumber(mergedHeadSegmentLengthValue);
          if (VVar14 == VVar15) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x50b,
                               "(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber())"
                               ,
                               "mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber()"
                              );
            if (!bVar8) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 0;
          }
          pVVar22 = ::Value::GetValueInfo(mergedHeadSegmentLengthValue);
          pVVar23 = ::Value::GetValueInfo(local_180);
          pVVar4 = mergedHeadSegmentLengthValue;
          pVVar26 = local_180;
          if (pVVar22 != pVVar23) {
            pJVar2 = this->alloc;
            pVVar22 = ::Value::GetValueInfo(local_180);
            paVar24 = &ValueInfo::Type(pVVar22)->field_0;
            pVVar22 = ::Value::GetValueInfo(mergedHeadSegmentLengthValue);
            paVar25 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                      ValueInfo::Type(pVVar22);
            aVar1.field_0 = *paVar25;
            newInstr_2._4_2_ = aVar1.field_0;
            merged = ValueType::Verify((ValueType)
                                       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                        &paVar24->field_0);
            local_1e.field_0 = aVar1.field_0;
            local_20.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::Verify(aVar1.field_0);
            local_22.field_0 = aVar1.field_0;
            bVar8 = ValueType::operator==((ValueType *)&paVar24->field_0,(ValueType)aVar1.field_0);
            if (bVar8) {
              local_a.field_0 = paVar24->field_0;
            }
            else {
              BVar11 = operator|(paVar24->bits,aVar1.bits);
              ValueType::ValueType((ValueType *)&local_24.field_0,BVar11);
              bVar8 = ValueType::OneOn((ValueType *)&local_24.field_0,Object);
              if (bVar8) {
                local_a.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject((ValueType *)&paVar24->field_0,aVar1.field_0);
              }
              else {
                local_a.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(local_24.field_0);
              }
            }
            newInstr_2._6_2_ = local_a.field_0;
            pVVar22 = ValueInfo::MergeLikelyIntValueInfo
                                (pJVar2,pVVar26,pVVar4,(ValueType)local_a.field_0);
            ::Value::SetValueInfo(pVVar26,pVVar22);
          }
        }
      }
    }
    pSVar5 = pSStack_158;
    if ((pSStack_158 != (StackSym *)0x0) && ((StackSym *)mergedValueInfo != pSStack_158)) {
      IVar9 = StackSym::GetType(pSStack_158);
      pRVar19 = IR::RegOpnd::New(pSVar5,IVar9,func_00);
      pVVar22 = mergedValueInfo;
      IVar9 = StackSym::GetType((StackSym *)mergedValueInfo);
      pRVar20 = IR::RegOpnd::New((StackSym *)pVVar22,IVar9,func_00);
      predecessorLengthValue =
           (Value *)IR::Instr::New(Ld_I4,&pRVar19->super_Opnd,&pRVar20->super_Opnd,func_00);
      pOVar21 = IR::Instr::GetDst((Instr *)predecessorLengthValue);
      IR::Opnd::SetIsJITOptimizedReg(pOVar21,true);
      pOVar21 = IR::Instr::GetSrc1((Instr *)predecessorLengthValue);
      IR::Opnd::SetIsJITOptimizedReg(pOVar21,true);
      IR::Instr::SetByteCodeOffset((Instr *)predecessorLengthValue,(Instr *)func);
      IR::Instr::InsertBefore((Instr *)func,(Instr *)predecessorLengthValue);
      newInstr._7_1_ = 1;
      BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                         ((predecessor->globOptData).liveVarSyms,
                          *(BVIndex *)&mergedValueInfo->symStore);
      if (BVar10 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x52d,
                           "(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id))",
                           "predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id)");
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Set
                ((predecessor->globOptData).liveVarSyms,(pSStack_158->super_Sym).m_id);
      mergedLengthValue = GlobOptBlockData::FindValue(this_00,(Sym *)mergedValueInfo);
      if (mergedLengthValue == (Value *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x530,"(predecessorLengthValue)","predecessorLengthValue");
        if (!bVar8) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar16 = 0;
      }
      GlobOptBlockData::SetValue(this_00,mergedLengthValue,&pSStack_158->super_Sym);
      if (bVar6) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((successor->globOptData).liveVarSyms,(pSStack_158->super_Sym).m_id);
        local_1a0 = GlobOptBlockData::FindValue(this_01,&pSStack_158->super_Sym);
        if (local_1a0 == (Value *)0x0) {
          pVVar26 = CopyValue(this,mergedLengthValue);
          GlobOptBlockData::SetValue(this_01,pVVar26,&pSStack_158->super_Sym);
        }
        else {
          VVar14 = ::Value::GetValueNumber(local_1a0);
          VVar15 = ::Value::GetValueNumber(mergedLengthValue);
          if (VVar14 == VVar15) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x539,
                               "(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber())"
                               ,
                               "mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber()"
                              );
            if (!bVar8) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar16 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar16 = 0;
          }
          pVVar22 = ::Value::GetValueInfo(mergedLengthValue);
          pVVar23 = ::Value::GetValueInfo(local_1a0);
          pVVar4 = mergedLengthValue;
          pVVar26 = local_1a0;
          if (pVVar22 != pVVar23) {
            pJVar2 = this->alloc;
            pVVar22 = ::Value::GetValueInfo(local_1a0);
            paVar24 = &ValueInfo::Type(pVVar22)->field_0;
            pVVar22 = ::Value::GetValueInfo(mergedLengthValue);
            paVar25 = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0 *)
                      ValueInfo::Type(pVVar22);
            aVar1.field_0 = *paVar25;
            local_1a4.field_0 = aVar1.field_0;
            merged_1 = ValueType::Verify((ValueType)
                                         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                          &paVar24->field_0);
            local_3e.field_0 = aVar1.field_0;
            local_40.field_0 =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::Verify(aVar1.field_0);
            this_local._6_2_ = aVar1.field_0;
            bVar8 = ValueType::operator==((ValueType *)&paVar24->field_0,(ValueType)aVar1.field_0);
            if (bVar8) {
              local_2a.field_0 = paVar24->field_0;
            }
            else {
              BVar11 = operator|(paVar24->bits,aVar1.bits);
              ValueType::ValueType((ValueType *)((long)&this_local + 4),BVar11);
              bVar8 = ValueType::OneOn((ValueType *)((long)&this_local + 4),Object);
              if (bVar8) {
                this_local._0_2_ = aVar1.field_0;
                local_2a.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::MergeWithObject((ValueType *)&paVar24->field_0,aVar1.field_0);
              }
              else {
                this_local._2_2_ = this_local._4_2_;
                local_2a.field_0 =
                     (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                     ValueType::Verify(this_local._4_2_);
              }
            }
            local_1a2.field_0 = local_2a.field_0;
            pVVar22 = ValueInfo::MergeLikelyIntValueInfo
                                (pJVar2,pVVar26,pVVar4,(ValueType)local_2a.field_0);
            ::Value::SetValueInfo(pVVar26,pVVar22);
          }
        }
      }
    }
    if ((newInstr._7_1_ & 1) != 0) {
      local_1b8.predecessorValue = (Value *)predecessorValueInfo;
      pJVar2 = this->alloc;
      paVar24 = &ValueInfo::Type(&predecessorArrayValueInfo->super_ValueInfo)->field_0;
      valueType.field_0 =
           (anon_union_2_4_ea848c7b_for_ValueType_13)
           *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar24->field_0;
      if (mergedHeadSegmentLengthSym == (StackSym *)0x0) {
        local_4c0 = predecessorHeadSegmentLengthSym;
      }
      else {
        local_4c0 = mergedHeadSegmentLengthSym;
      }
      if (mergedLengthSym == (StackSym *)0x0) {
        local_4d0 = predecessorLengthSym;
      }
      else {
        local_4d0 = mergedLengthSym;
      }
      if (pSStack_158 == (StackSym *)0x0) {
        local_4e0 = (StackSym *)mergedValueInfo;
      }
      else {
        local_4e0 = pSStack_158;
      }
      symStore = ValueInfo::GetSymStore(&predecessorArrayValueInfo->super_ValueInfo);
      local_1b8.valueInfo =
           ArrayValueInfo::New(pJVar2,valueType,local_4c0,local_4d0,local_4e0,symStore);
      JsUtil::
      List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((List<DelayChangeValueInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)&it.
                super_IteratorBase<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                .usedEntryCount,&local_1b8);
    }
    JsUtil::
    BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::
    EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
    ::MoveNext((EntryIterator<const_JsUtil::BaseDictionary<Sym_*,_ValueInfo_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                *)local_e0);
  } while( true );
}

Assistant:

void GlobOpt::InsertValueCompensation(
    BasicBlock *const predecessor,
    BasicBlock *const successor,
    const SymToValueInfoMap *symsRequiringCompensationToMergedValueInfoMap)
{
    Assert(predecessor);
    Assert(successor);
    AssertOrFailFast(predecessor != successor);
    Assert(symsRequiringCompensationToMergedValueInfoMap->Count() != 0);

    IR::Instr *insertBeforeInstr = predecessor->GetLastInstr();
    Func *const func = insertBeforeInstr->m_func;
    bool setLastInstrInPredecessor;
    // If this is a loop back edge, and the successor has been completed, don't attempt to update its block data.
    // The update is unnecessary, and the data has likely been freed.
    bool updateSuccessorBlockData = !this->isPerformingLoopBackEdgeCompensation || successor->GetDataUseCount() > 0;

    if(insertBeforeInstr->IsBranchInstr() || insertBeforeInstr->m_opcode == Js::OpCode::BailTarget)
    {
        // Don't insert code between the branch and the corresponding ByteCodeUses instructions
        while(insertBeforeInstr->m_prev->m_opcode == Js::OpCode::ByteCodeUses)
        {
            insertBeforeInstr = insertBeforeInstr->m_prev;
        }
        setLastInstrInPredecessor = false;
    }
    else
    {
        // Insert at the end of the block and set the last instruction
        Assert(insertBeforeInstr->m_next);
        insertBeforeInstr = insertBeforeInstr->m_next; // Instruction after the last instruction in the predecessor
        setLastInstrInPredecessor = true;
    }

    GlobOptBlockData &predecessorBlockData = predecessor->globOptData;
    GlobOptBlockData &successorBlockData = successor->globOptData;
    struct DelayChangeValueInfo
    {
        Value* predecessorValue;
        ArrayValueInfo* valueInfo;
        void ChangeValueInfo(BasicBlock* predecessor, GlobOpt* g)
        {
            g->ChangeValueInfo(
                predecessor,
                predecessorValue,
                valueInfo,
                false /*allowIncompatibleType*/,
                true /*compensated*/);
        }
    };
    JsUtil::List<DelayChangeValueInfo, ArenaAllocator> delayChangeValueInfo(alloc);
    for(auto it = symsRequiringCompensationToMergedValueInfoMap->GetIterator(); it.IsValid(); it.MoveNext())
    {
        const auto &entry = it.Current();
        Sym *const sym = entry.Key();
        Value *const predecessorValue = predecessorBlockData.FindValue(sym);
        Assert(predecessorValue);
        ValueInfo *const predecessorValueInfo = predecessorValue->GetValueInfo();

        // Currently, array value infos are the only ones that require compensation based on values
        Assert(predecessorValueInfo->IsAnyOptimizedArray());
        const ArrayValueInfo *const predecessorArrayValueInfo = predecessorValueInfo->AsArrayValueInfo();
        StackSym *const predecessorHeadSegmentSym = predecessorArrayValueInfo->HeadSegmentSym();
        StackSym *const predecessorHeadSegmentLengthSym = predecessorArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const predecessorLengthSym = predecessorArrayValueInfo->LengthSym();
        ValueInfo *const mergedValueInfo = entry.Value();
        const ArrayValueInfo *const mergedArrayValueInfo = mergedValueInfo->AsArrayValueInfo();
        StackSym *const mergedHeadSegmentSym = mergedArrayValueInfo->HeadSegmentSym();
        StackSym *const mergedHeadSegmentLengthSym = mergedArrayValueInfo->HeadSegmentLengthSym();
        StackSym *const mergedLengthSym = mergedArrayValueInfo->LengthSym();
        Assert(!mergedHeadSegmentSym || predecessorHeadSegmentSym);
        Assert(!mergedHeadSegmentLengthSym || predecessorHeadSegmentLengthSym);
        Assert(!mergedLengthSym || predecessorLengthSym);

        bool compensated = false;
        if(mergedHeadSegmentSym && predecessorHeadSegmentSym != mergedHeadSegmentSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentSym, mergedHeadSegmentSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentSym, predecessorHeadSegmentSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;
        }

        if(mergedHeadSegmentLengthSym && predecessorHeadSegmentLengthSym != mergedHeadSegmentLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_A,
                    IR::RegOpnd::New(mergedHeadSegmentLengthSym, mergedHeadSegmentLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorHeadSegmentLengthSym, predecessorHeadSegmentLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the head segment length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorHeadSegmentLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
            Value *const predecessorHeadSegmentLengthValue =
                predecessorBlockData.FindValue(predecessorHeadSegmentLengthSym);
            Assert(predecessorHeadSegmentLengthValue);
            predecessorBlockData.SetValue(predecessorHeadSegmentLengthValue, mergedHeadSegmentLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedHeadSegmentLengthSym->m_id);
                Value *const mergedHeadSegmentLengthValue = successorBlockData.FindValue(mergedHeadSegmentLengthSym);
                if(mergedHeadSegmentLengthValue)
                {
                    Assert(mergedHeadSegmentLengthValue->GetValueNumber() != predecessorHeadSegmentLengthValue->GetValueNumber());
                    if(predecessorHeadSegmentLengthValue->GetValueInfo() != mergedHeadSegmentLengthValue->GetValueInfo())
                    {
                        mergedHeadSegmentLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedHeadSegmentLengthValue,
                                predecessorHeadSegmentLengthValue,
                                mergedHeadSegmentLengthValue->GetValueInfo()->Type()
                                    .Merge(predecessorHeadSegmentLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorHeadSegmentLengthValue), mergedHeadSegmentLengthSym);
                }
            }
        }

        if(mergedLengthSym && predecessorLengthSym != mergedLengthSym)
        {
            IR::Instr *const newInstr =
                IR::Instr::New(
                    Js::OpCode::Ld_I4,
                    IR::RegOpnd::New(mergedLengthSym, mergedLengthSym->GetType(), func),
                    IR::RegOpnd::New(predecessorLengthSym, predecessorLengthSym->GetType(), func),
                    func);
            newInstr->GetDst()->SetIsJITOptimizedReg(true);
            newInstr->GetSrc1()->SetIsJITOptimizedReg(true);
            newInstr->SetByteCodeOffset(insertBeforeInstr);
            insertBeforeInstr->InsertBefore(newInstr);
            compensated = true;

            // Merge the length value
            Assert(predecessorBlockData.liveVarSyms->Test(predecessorLengthSym->m_id));
            predecessorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
            Value *const predecessorLengthValue = predecessorBlockData.FindValue(predecessorLengthSym);
            Assert(predecessorLengthValue);
            predecessorBlockData.SetValue(predecessorLengthValue, mergedLengthSym);

            if (updateSuccessorBlockData)
            {
                successorBlockData.liveVarSyms->Set(mergedLengthSym->m_id);
                Value *const mergedLengthValue = successorBlockData.FindValue(mergedLengthSym);
                if(mergedLengthValue)
                {
                    Assert(mergedLengthValue->GetValueNumber() != predecessorLengthValue->GetValueNumber());
                    if(predecessorLengthValue->GetValueInfo() != mergedLengthValue->GetValueInfo())
                    {
                        mergedLengthValue->SetValueInfo(
                            ValueInfo::MergeLikelyIntValueInfo(
                                this->alloc,
                                mergedLengthValue,
                                predecessorLengthValue,
                                mergedLengthValue->GetValueInfo()->Type().Merge(predecessorLengthValue->GetValueInfo()->Type())));
                    }
                }
                else
                {
                    successorBlockData.SetValue(CopyValue(predecessorLengthValue), mergedLengthSym);
                }
            }
        }

        if(compensated)
        {
            // Save the new ValueInfo for later.
            // We don't want other symbols needing compensation to see this new one
            delayChangeValueInfo.Add({
                predecessorValue,
                ArrayValueInfo::New(
                    alloc,
                    predecessorValueInfo->Type(),
                    mergedHeadSegmentSym ? mergedHeadSegmentSym : predecessorHeadSegmentSym,
                    mergedHeadSegmentLengthSym ? mergedHeadSegmentLengthSym : predecessorHeadSegmentLengthSym,
                    mergedLengthSym ? mergedLengthSym : predecessorLengthSym,
                    predecessorValueInfo->GetSymStore())
            });
        }
    }

    // Once we've compensated all the symbols, update the new ValueInfo.
    delayChangeValueInfo.Map([predecessor, this](int, DelayChangeValueInfo d) { d.ChangeValueInfo(predecessor, this); });

    if(setLastInstrInPredecessor)
    {
        predecessor->SetLastInstr(insertBeforeInstr->m_prev);
    }
}